

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaD_throw(lua_State *L,int errcode)

{
  lua_longjmp *plVar1;
  StkId level;
  
  plVar1 = L->errorJmp;
  if (plVar1 == (lua_longjmp *)0x0) {
    L->status = (lu_byte)errcode;
    if (L->l_G->panic != (lua_CFunction)0x0) {
      L->ci = L->base_ci;
      level = L->base_ci->base;
      L->base = level;
      luaF_close(L,level);
      luaD_seterrorobj(L,errcode,L->base);
      L->nCcalls = L->baseCcalls;
      L->allowhook = '\x01';
      restore_stack_limit(L);
      L->errorJmp = (lua_longjmp *)0x0;
      L->errfunc = 0;
      (*L->l_G->panic)(L);
    }
    exit(1);
  }
  plVar1->status = errcode;
  longjmp((__jmp_buf_tag *)plVar1->b,1);
}

Assistant:

static void luaD_throw(lua_State*L,int errcode){
if(L->errorJmp){
L->errorJmp->status=errcode;
LUAI_THROW(L,L->errorJmp);
}
else{
L->status=cast_byte(errcode);
if(G(L)->panic){
resetstack(L,errcode);
G(L)->panic(L);
}
exit(EXIT_FAILURE);
}
}